

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestDepfileRemoved::Run(GraphTestDepfileRemoved *this)

{
  State *state;
  VirtualFileSystem *this_00;
  int *piVar1;
  DependencyScan *this_01;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  string err;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_GraphTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule catdep\n  depfile = $out.d\n  command = cat $in > $out\nbuild ./out.o: catdep ./foo.cc\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"foo.h",&local_72);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    this_00 = &(this->super_GraphTest).fs_;
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"foo.cc",&local_72);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    piVar1 = &(this->super_GraphTest).fs_.now_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out.o.d",&local_72);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"out.o: foo.h\n",&local_71);
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out.o",&local_72);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
    VirtualFileSystem::Create(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pTVar3 = g_current_test;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.o",&local_72);
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
    this_01 = &(this->super_GraphTest).scan_;
    bVar4 = DependencyScan::RecomputeDirty(this_01,pNVar5,&local_50);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x108,"scan_.RecomputeDirty(GetNode(\"out.o\"), &err)");
    std::__cxx11::string::~string((string *)&local_70);
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_50);
    bVar4 = testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0x109,"\"\" == err");
    pTVar3 = g_current_test;
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.o",&local_72);
      pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
      testing::Test::Check
                (pTVar3,(bool)(pNVar5->dirty_ ^ 1),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,0x10a,"GetNode(\"out.o\")->dirty()");
      std::__cxx11::string::~string((string *)&local_70);
      State::Reset(state);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.o.d",&local_72);
      VirtualFileSystem::RemoveFile(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      pTVar3 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.o",&local_72);
      pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
      bVar4 = DependencyScan::RecomputeDirty(this_01,pNVar5,&local_50);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,0x10e,"scan_.RecomputeDirty(GetNode(\"out.o\"), &err)");
      std::__cxx11::string::~string((string *)&local_70);
      pTVar3 = g_current_test;
      bVar4 = std::operator==("",&local_50);
      bVar4 = testing::Test::Check
                        (pTVar3,bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                         ,0x10f,"\"\" == err");
      pTVar3 = g_current_test;
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.o",&local_72);
        pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
        testing::Test::Check
                  (pTVar3,pNVar5->dirty_,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                   ,0x110,"GetNode(\"out.o\")->dirty()");
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(GraphTest, DepfileRemoved) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule catdep\n"
"  depfile = $out.d\n"
"  command = cat $in > $out\n"
"build ./out.o: catdep ./foo.cc\n"));
  fs_.Create("foo.h", "");
  fs_.Create("foo.cc", "");
  fs_.Tick();
  fs_.Create("out.o.d", "out.o: foo.h\n");
  fs_.Create("out.o", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.o"), &err));
  ASSERT_EQ("", err);
  EXPECT_FALSE(GetNode("out.o")->dirty());

  state_.Reset();
  fs_.RemoveFile("out.o.d");
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.o"), &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(GetNode("out.o")->dirty());
}